

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O1

int test_relaxng(void)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  FILE *pFVar11;
  xmlDocPtr pxVar12;
  undefined8 uVar13;
  xmlDocPtr pxVar14;
  xmlDocPtr val;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  char *pcVar15;
  int n_output;
  int iVar16;
  uint uVar17;
  undefined4 uVar18;
  ulong uVar19;
  xmlNodePtr pxVar20;
  int n_elem;
  uint uVar21;
  uint uVar22;
  undefined8 *puVar23;
  int test_ret_1;
  undefined4 *puVar24;
  int test_ret;
  int iVar25;
  uint *puVar26;
  int *piVar27;
  int test_ret_4;
  int test_ret_5;
  int test_ret_2;
  int test_ret_3;
  int local_44;
  int local_40;
  int local_3c;
  
  if (quiet == '\0') {
    puts("Testing relaxng : 14 of 25 functions ...");
  }
  iVar25 = 0;
  iVar16 = 0;
  do {
    iVar2 = xmlMemBlocks();
    if (iVar16 == 0) {
      pFVar11 = fopen64("test.out","a+");
    }
    else {
      pFVar11 = (FILE *)0x0;
    }
    xmlRelaxNGDump(pFVar11);
    call_tests = call_tests + 1;
    if (pFVar11 != (FILE *)0x0) {
      fclose(pFVar11);
    }
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar2 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGDump",(ulong)(uint)(iVar3 - iVar2));
      iVar25 = iVar25 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 == 1);
  function_tests = function_tests + 1;
  iVar2 = 0;
  iVar16 = 0;
  do {
    iVar3 = xmlMemBlocks();
    if (iVar16 == 0) {
      pFVar11 = fopen64("test.out","a+");
    }
    else {
      pFVar11 = (FILE *)0x0;
    }
    xmlRelaxNGDumpTree(pFVar11);
    call_tests = call_tests + 1;
    if (pFVar11 != (FILE *)0x0) {
      fclose(pFVar11);
    }
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGDumpTree",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d");
      printf(" %d");
      putchar(10);
    }
    iVar16 = iVar16 + 1;
  } while (iVar16 == 1);
  function_tests = function_tests + 1;
  iVar16 = xmlMemBlocks();
  xmlRelaxNGGetParserErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar3 = xmlMemBlocks();
  if (iVar16 != iVar3) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlRelaxNGGetParserErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar4 = xmlMemBlocks();
  uVar19 = 0;
  xmlRelaxNGGetValidErrors(0,0,0,0);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar4 != iVar5) {
    xmlMemBlocks();
    printf("Leak of %d blocks found in xmlRelaxNGGetValidErrors");
    printf(" %d");
    printf(" %d");
    printf(" %d");
    uVar19 = 0;
    printf(" %d");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  xmlRelaxNGInitTypes();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    iVar8 = xmlMemBlocks();
    uVar19 = (ulong)(uint)(iVar8 - iVar6);
    printf("Leak of %d blocks found in xmlRelaxNGInitTypes");
    putchar(10);
  }
  function_tests = function_tests + 1;
  uVar17 = 0;
  local_3c = 0;
  do {
    iVar8 = xmlMemBlocks();
    pxVar12 = gen_xmlDocPtr(uVar17,(int)uVar19);
    uVar13 = xmlRelaxNGNewDocParserCtxt(pxVar12);
    xmlRelaxNGFreeParserCtxt(uVar13);
    call_tests = call_tests + 1;
    if (((pxVar12 != (xmlDocPtr)0x0) && (api_doc != pxVar12)) && (pxVar12->doc != api_doc)) {
      xmlFreeDoc(pxVar12);
    }
    xmlResetLastError();
    iVar9 = xmlMemBlocks();
    if (iVar8 != iVar9) {
      iVar9 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGNewDocParserCtxt",(ulong)(uint)(iVar9 - iVar8));
      local_3c = local_3c + 1;
      uVar19 = (ulong)uVar17;
      printf(" %d");
      putchar(10);
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  function_tests = function_tests + 1;
  uVar17 = 0;
  iVar8 = 0;
  do {
    puVar26 = &DAT_00157174;
    pxVar12 = (xmlDocPtr)0x0;
    do {
      iVar9 = xmlMemBlocks();
      if (uVar17 == 0) {
        bVar1 = false;
        pcVar15 = "foo";
      }
      else if (uVar17 == 2) {
        bVar1 = false;
        pcVar15 = "test/ent2";
      }
      else if (uVar17 == 1) {
        bVar1 = false;
        pcVar15 = "<foo/>";
      }
      else {
        bVar1 = true;
        pcVar15 = (char *)0x0;
      }
      uVar22 = 0xffffffff;
      uVar21 = (uint)pxVar12;
      if (uVar21 < 4) {
        uVar22 = *puVar26;
      }
      if ((!bVar1) && (iVar10 = xmlStrlen(pcVar15), iVar10 < (int)uVar22)) {
        uVar22 = 0;
      }
      val = (xmlDocPtr)(ulong)uVar22;
      uVar13 = xmlRelaxNGNewMemParserCtxt(pcVar15);
      xmlRelaxNGFreeParserCtxt(uVar13);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar10 = xmlMemBlocks();
      if (iVar9 != iVar10) {
        iVar10 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGNewMemParserCtxt",(ulong)(uint)(iVar10 - iVar9)
              );
        iVar8 = iVar8 + 1;
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
        val = pxVar12;
      }
      uVar21 = uVar21 + 1;
      pxVar12 = (xmlDocPtr)(ulong)uVar21;
      puVar26 = puVar26 + 1;
    } while (uVar21 != 4);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  function_tests = function_tests + 1;
  puVar23 = &DAT_00159d48;
  uVar17 = 0;
  local_44 = 0;
  do {
    iVar9 = xmlMemBlocks();
    if (uVar17 < 3) {
      uVar13 = *puVar23;
    }
    else {
      uVar13 = 0;
    }
    xmlRelaxNGNewParserCtxt(uVar13);
    xmlRelaxNGFreeParserCtxt();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGNewParserCtxt",(ulong)(uint)(iVar10 - iVar9));
      local_44 = local_44 + 1;
      val = (xmlDocPtr)(ulong)uVar17;
      printf(" %d");
      putchar(10);
    }
    uVar17 = uVar17 + 1;
    puVar23 = puVar23 + 1;
  } while (uVar17 != 4);
  iVar16 = iVar2 + iVar25 + (uint)(iVar16 != iVar3) + (uint)(iVar4 != iVar5) +
           (uint)(iVar6 != iVar7) + local_3c;
  function_tests = function_tests + 1;
  uVar17 = 0;
  local_40 = 0;
  do {
    iVar2 = (int)val;
    iVar25 = xmlMemBlocks();
    pxVar12 = gen_xmlDocPtr(uVar17,iVar2);
    val = pxVar12;
    xmlRelaxNGValidateDoc(0);
    call_tests = call_tests + 1;
    if (((pxVar12 != (xmlDocPtr)0x0) && (api_doc != pxVar12)) && (pxVar12->doc != api_doc)) {
      xmlFreeDoc(pxVar12);
    }
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar25 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxNGValidateDoc",(ulong)(uint)(iVar2 - iVar25));
      local_40 = local_40 + 1;
      printf(" %d",0);
      val = (xmlDocPtr)(ulong)uVar17;
      printf(" %d");
      putchar(10);
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar17 = 0;
  do {
    pxVar12 = (xmlDocPtr)0x0;
    do {
      iVar25 = (int)val;
      iVar2 = xmlMemBlocks();
      pxVar14 = gen_xmlDocPtr(uVar17,iVar25);
      iVar3 = (int)pxVar12;
      val = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar25);
      xmlRelaxNGValidateFullElement(0,pxVar14,val);
      call_tests = call_tests + 1;
      iVar25 = extraout_EDX;
      if (((pxVar14 != (xmlDocPtr)0x0) && (api_doc != pxVar14)) && (pxVar14->doc != api_doc)) {
        xmlFreeDoc(pxVar14);
        iVar25 = extraout_EDX_00;
      }
      des_xmlNodePtr(iVar3,(xmlNodePtr)val,iVar25);
      xmlResetLastError();
      iVar25 = xmlMemBlocks();
      if (iVar2 != iVar25) {
        iVar25 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidateFullElement",
               (ulong)(uint)(iVar25 - iVar2));
        local_3c = local_3c + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
        val = pxVar12;
      }
      pxVar12 = (xmlDocPtr)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 3);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  iVar16 = iVar16 + iVar8 + local_44;
  function_tests = function_tests + 1;
  local_44 = 0;
  uVar17 = 0;
  do {
    pxVar12 = (xmlDocPtr)0x0;
    do {
      iVar25 = (int)val;
      iVar2 = xmlMemBlocks();
      pxVar14 = gen_xmlDocPtr(uVar17,iVar25);
      iVar3 = (int)pxVar12;
      val = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar25);
      xmlRelaxNGValidatePopElement(0,pxVar14,val);
      call_tests = call_tests + 1;
      iVar25 = extraout_EDX_01;
      if (((pxVar14 != (xmlDocPtr)0x0) && (api_doc != pxVar14)) && (pxVar14->doc != api_doc)) {
        xmlFreeDoc(pxVar14);
        iVar25 = extraout_EDX_02;
      }
      des_xmlNodePtr(iVar3,(xmlNodePtr)val,iVar25);
      xmlResetLastError();
      iVar25 = xmlMemBlocks();
      if (iVar2 != iVar25) {
        iVar25 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidatePopElement",
               (ulong)(uint)(iVar25 - iVar2));
        local_44 = local_44 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
        val = pxVar12;
      }
      pxVar12 = (xmlDocPtr)(ulong)(iVar3 + 1U);
    } while (iVar3 + 1U != 3);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  function_tests = function_tests + 1;
  iVar16 = iVar16 + local_40;
  uVar17 = 0;
  local_40 = 0;
  do {
    piVar27 = &DAT_00157174;
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar25 = xmlMemBlocks();
      switch(uVar17) {
      case 0:
        bVar1 = false;
        pcVar15 = "foo";
        break;
      case 1:
        bVar1 = false;
        pcVar15 = "<foo/>";
        break;
      case 2:
        bVar1 = false;
        pcVar15 = anon_var_dwarf_197;
        break;
      case 3:
        bVar1 = false;
        pcVar15 = " 2ab ";
        break;
      default:
        bVar1 = true;
        pcVar15 = (char *)0x0;
      }
      iVar2 = -1;
      uVar22 = (uint)pxVar20;
      if (uVar22 < 4) {
        iVar2 = *piVar27;
      }
      if ((!bVar1) && (iVar3 = xmlStrlen(pcVar15), iVar3 < iVar2)) {
        iVar2 = 0;
      }
      xmlRelaxNGValidatePushCData(0,pcVar15,iVar2);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar25 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
               (ulong)(uint)(iVar2 - iVar25));
        local_40 = local_40 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
        pcVar15 = (char *)pxVar20;
      }
      uVar22 = uVar22 + 1;
      pxVar20 = (xmlNodePtr)(ulong)uVar22;
      piVar27 = piVar27 + 1;
    } while (uVar22 != 4);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 5);
  function_tests = function_tests + 1;
  iVar25 = 0;
  uVar17 = 0;
  do {
    pxVar20 = (xmlNodePtr)0x0;
    do {
      iVar2 = (int)pcVar15;
      iVar3 = xmlMemBlocks();
      pxVar12 = gen_xmlDocPtr(uVar17,iVar2);
      iVar4 = (int)pxVar20;
      pcVar15 = (char *)gen_xmlNodePtr(iVar4,iVar2);
      xmlRelaxNGValidatePushElement(0,pxVar12,pcVar15);
      call_tests = call_tests + 1;
      iVar2 = extraout_EDX_03;
      if (((pxVar12 != (xmlDocPtr)0x0) && (api_doc != pxVar12)) && (pxVar12->doc != api_doc)) {
        xmlFreeDoc(pxVar12);
        iVar2 = extraout_EDX_04;
      }
      des_xmlNodePtr(iVar4,(xmlNodePtr)pcVar15,iVar2);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar3 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlRelaxNGValidatePushElement",
               (ulong)(uint)(iVar2 - iVar3));
        iVar25 = iVar25 + 1;
        printf(" %d",0);
        printf(" %d",(ulong)uVar17);
        printf(" %d");
        putchar(10);
        pcVar15 = (char *)pxVar20;
      }
      pxVar20 = (xmlNodePtr)(ulong)(iVar4 + 1U);
    } while (iVar4 + 1U != 3);
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  function_tests = function_tests + 1;
  puVar24 = &DAT_00157174;
  uVar17 = 0;
  iVar2 = 0;
  do {
    iVar3 = xmlMemBlocks();
    uVar18 = 0xffffffff;
    if (uVar17 < 4) {
      uVar18 = *puVar24;
    }
    xmlRelaxParserSetFlag(0,uVar18);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRelaxParserSetFlag",(ulong)(uint)(iVar4 - iVar3));
      iVar2 = iVar2 + 1;
      printf(" %d",0);
      printf(" %d",(ulong)uVar17);
      putchar(10);
    }
    uVar17 = uVar17 + 1;
    puVar24 = puVar24 + 1;
  } while (uVar17 != 4);
  function_tests = function_tests + 1;
  uVar17 = iVar16 + local_3c + local_44 + local_40 + iVar25 + iVar2;
  if (uVar17 != 0) {
    printf("Module relaxng: %d errors\n",(ulong)uVar17);
  }
  return uVar17;
}

Assistant:

static int
test_relaxng(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing relaxng : 14 of 25 functions ...\n");
    test_ret += test_xmlRelaxNGDump();
    test_ret += test_xmlRelaxNGDumpTree();
    test_ret += test_xmlRelaxNGGetParserErrors();
    test_ret += test_xmlRelaxNGGetValidErrors();
    test_ret += test_xmlRelaxNGInitTypes();
    test_ret += test_xmlRelaxNGNewDocParserCtxt();
    test_ret += test_xmlRelaxNGNewMemParserCtxt();
    test_ret += test_xmlRelaxNGNewParserCtxt();
    test_ret += test_xmlRelaxNGNewValidCtxt();
    test_ret += test_xmlRelaxNGParse();
    test_ret += test_xmlRelaxNGSetParserErrors();
    test_ret += test_xmlRelaxNGSetParserStructuredErrors();
    test_ret += test_xmlRelaxNGSetResourceLoader();
    test_ret += test_xmlRelaxNGSetValidErrors();
    test_ret += test_xmlRelaxNGSetValidStructuredErrors();
    test_ret += test_xmlRelaxNGValidateDoc();
    test_ret += test_xmlRelaxNGValidateFullElement();
    test_ret += test_xmlRelaxNGValidatePopElement();
    test_ret += test_xmlRelaxNGValidatePushCData();
    test_ret += test_xmlRelaxNGValidatePushElement();
    test_ret += test_xmlRelaxParserSetFlag();

    if (test_ret != 0)
	printf("Module relaxng: %d errors\n", test_ret);
    return(test_ret);
}